

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

item<mpt::layout::graph> * __thiscall
mpt::unique_array<mpt::item<mpt::layout::graph>_>::insert
          (unique_array<mpt::item<mpt::layout::graph>_> *this,long pos)

{
  content<mpt::item<mpt::layout::graph>_> *pcVar1;
  type_traits *ptVar2;
  _func_int_void_ptr_void_ptr *p_Var3;
  bool bVar4;
  int iVar5;
  item<mpt::layout::graph> *this_00;
  ulong uVar6;
  
  pcVar1 = (this->_ref)._ref;
  if (pcVar1 == (content<mpt::item<mpt::layout::graph>_> *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (pcVar1->super_buffer)._used >> 5;
  }
  if (pos < 0) {
    pos = pos + uVar6;
    if (pos < 0) {
      return (item<mpt::layout::graph> *)0x0;
    }
  }
  else if (uVar6 <= (ulong)pos) {
    uVar6 = pos;
  }
  bVar4 = reserve(this,uVar6 + 1);
  if (bVar4) {
    pcVar1 = (this->_ref)._ref;
    this_00 = (item<mpt::layout::graph> *)
              content<mpt::item<mpt::layout::graph>_>::insert(pcVar1,pos);
    if (this_00 != (item<mpt::layout::graph> *)0x0) {
      ptVar2 = (pcVar1->super_buffer)._content_traits;
      if (((ptVar2 != (type_traits *)0x0) &&
          (p_Var3 = ptVar2->init, p_Var3 != (_func_int_void_ptr_void_ptr *)0x0)) &&
         (iVar5 = (*p_Var3)(this_00,(void *)0x0), -1 < iVar5)) {
        return this_00;
      }
      item<mpt::layout::graph>::item(this_00,(graph *)0x0);
      return this_00;
    }
  }
  return (item<mpt::layout::graph> *)0x0;
}

Assistant:

T *insert(long pos)
	{
		long len = length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!reserve(len + 1)) {
			return 0;
		}
		content<T> *d = _ref.instance();
		/* inserted raw data is NOT initialized */
		void *ptr = d->insert(pos);
		if (!ptr) {
			return 0;
		}
		const struct type_traits *traits = d->content_traits();
		if (traits && traits->init && traits->init(ptr, 0) >= 0) {
			return static_cast<T *>(ptr);
		}
		return new (ptr) T;
	}